

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O2

void __thiscall
duckdb::DatabaseInstance::SetExtensionLoaded
          (DatabaseInstance *this,string *name,ExtensionInstallInfo *install_info)

{
  pointer puVar1;
  __uniq_ptr_impl<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
  __p;
  int iVar2;
  mapped_type *pmVar3;
  pointer pEVar4;
  Logger *this_00;
  unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>
  *callback;
  pointer this_01;
  __uniq_ptr_impl<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
  local_50;
  string extension_name;
  
  ExtensionHelper::GetExtensionName(&extension_name,name);
  pmVar3 = ::std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionInfo>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionInfo>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionInfo>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionInfo>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this->loaded_extensions_info,&extension_name);
  pmVar3->is_loaded = true;
  make_uniq<duckdb::ExtensionInstallInfo,duckdb::ExtensionInstallInfo&>
            ((duckdb *)&local_50,install_info);
  pmVar3 = ::std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionInfo>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionInfo>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionInfo>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionInfo>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this->loaded_extensions_info,&extension_name);
  __p._M_t.
  super__Tuple_impl<0UL,_duckdb::ExtensionInstallInfo_*,_std::default_delete<duckdb::ExtensionInstallInfo>_>
  .super__Head_base<0UL,_duckdb::ExtensionInstallInfo_*,_false>._M_head_impl =
       local_50._M_t.
       super__Tuple_impl<0UL,_duckdb::ExtensionInstallInfo_*,_std::default_delete<duckdb::ExtensionInstallInfo>_>
       .super__Head_base<0UL,_duckdb::ExtensionInstallInfo_*,_false>._M_head_impl;
  local_50._M_t.
  super__Tuple_impl<0UL,_duckdb::ExtensionInstallInfo_*,_std::default_delete<duckdb::ExtensionInstallInfo>_>
  .super__Head_base<0UL,_duckdb::ExtensionInstallInfo_*,_false>._M_head_impl =
       (tuple<duckdb::ExtensionInstallInfo_*,_std::default_delete<duckdb::ExtensionInstallInfo>_>)
       (_Tuple_impl<0UL,_duckdb::ExtensionInstallInfo_*,_std::default_delete<duckdb::ExtensionInstallInfo>_>
        )0x0;
  ::std::
  __uniq_ptr_impl<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
  ::reset((__uniq_ptr_impl<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
           *)&pmVar3->install_info,
          (pointer)__p._M_t.
                   super__Tuple_impl<0UL,_duckdb::ExtensionInstallInfo_*,_std::default_delete<duckdb::ExtensionInstallInfo>_>
                   .super__Head_base<0UL,_duckdb::ExtensionInstallInfo_*,_false>._M_head_impl);
  ::std::
  unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>::
  ~unique_ptr((unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
               *)&local_50);
  puVar1 = (this->config).extension_callbacks.
           super_vector<duckdb::unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_01 = (this->config).extension_callbacks.
                 super_vector<duckdb::unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_01 != puVar1; this_01 = this_01 + 1
      ) {
    pEVar4 = unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>
             ::operator->(this_01);
    (**(code **)(*(long *)pEVar4 + 0x20))(pEVar4,this,name);
  }
  this_00 = Logger::Get(this);
  iVar2 = (*this_00->_vptr_Logger[2])(this_00,"duckdb.Extensions.ExtensionLoaded",0x1e);
  if ((char)iVar2 != '\0') {
    Logger::WriteLog(this_00,"duckdb.Extensions.ExtensionLoaded",LOG_INFO,name);
  }
  ::std::__cxx11::string::~string((string *)&extension_name);
  return;
}

Assistant:

void DatabaseInstance::SetExtensionLoaded(const string &name, ExtensionInstallInfo &install_info) {
	auto extension_name = ExtensionHelper::GetExtensionName(name);
	loaded_extensions_info[extension_name].is_loaded = true;
	loaded_extensions_info[extension_name].install_info = make_uniq<ExtensionInstallInfo>(install_info);

	auto &callbacks = DBConfig::GetConfig(*this).extension_callbacks;
	for (auto &callback : callbacks) {
		callback->OnExtensionLoaded(*this, name);
	}
	DUCKDB_LOG_INFO(*this, "duckdb.Extensions.ExtensionLoaded", name);
}